

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::StringVector::ByteSizeLong(StringVector *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Type *pTVar4;
  uint index;
  int n;
  ulong uVar5;
  
  uVar1 = (this->vector_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    index = 0;
    do {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->vector_).super_RepeatedPtrFieldBase,index);
      uVar3 = (uint)pTVar4->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = uVar5 + pTVar4->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar1 != index);
  }
  this->_cached_size_ = (int)uVar5;
  return uVar5;
}

Assistant:

size_t StringVector::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.StringVector)
  size_t total_size = 0;

  // repeated string vector = 1;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->vector_size());
  for (int i = 0, n = this->vector_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->vector(i));
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}